

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall
cubeb_init_destroy_multiple_contexts_Test::TestBody(cubeb_init_destroy_multiple_contexts_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int order [4];
  cubeb *ctx [4];
  int r;
  size_t i;
  anon_enum_32 *in_stack_ffffffffffffff20;
  int *piVar5;
  unsigned_long *in_stack_ffffffffffffff28;
  AssertHelper in_stack_ffffffffffffff30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  AssertionResult local_b8;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar6;
  char *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  AssertHelper local_78;
  Message local_70;
  size_t local_68;
  size_t local_60;
  AssertionResult local_58;
  int local_48 [4];
  cubeb *local_38 [4];
  int local_14;
  int *local_10;
  
  local_48[0] = 2;
  local_48[1] = 0;
  local_48[2] = 3;
  local_48[3] = 1;
  local_60 = ARRAY_LENGTH<cubeb*,4ul>(&local_38);
  local_68 = ARRAY_LENGTH<int,4ul>(&local_48);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)in_stack_ffffffffffffff38.ptr_,(char *)in_stack_ffffffffffffff30.data_,
             in_stack_ffffffffffffff28,(unsigned_long *)in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30.data_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x136eee);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_sanity.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x136f2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136f4e);
  if (bVar1) {
    local_10 = (int *)0x0;
    while (piVar5 = local_10, piVar3 = (int *)ARRAY_LENGTH<cubeb*,4ul>(&local_38), piVar5 < piVar3)
    {
      local_14 = common_init((cubeb **)in_stack_ffffffffffffff30.data_,(char *)piVar5);
      uVar6 = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)in_stack_ffffffffffffff38.ptr_,(char *)in_stack_ffffffffffffff30.data_,
                 piVar5,in_stack_ffffffffffffff20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff70);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff30.data_);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13700e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_sanity.cpp"
                   ,0x69,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&stack0xffffffffffffff60);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::Message::~Message((Message *)0x13704f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13706b);
      if (!bVar1) {
        return;
      }
      testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
                ((char *)in_stack_ffffffffffffff78.ptr_,in_stack_ffffffffffffff70,
                 (cubeb **)CONCAT44(uVar6,in_stack_ffffffffffffff68),
                 (void **)in_stack_ffffffffffffff60.ptr_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff30.data_);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1370dd);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_sanity.cpp"
                   ,0x6a,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff30,(Message *)&stack0xffffffffffffff38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
        testing::Message::~Message((Message *)0x13711e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13713a);
      if (!bVar1) {
        return;
      }
      local_10 = (int *)((long)local_10 + 1);
    }
    local_10 = (int *)0x0;
    while (piVar5 = local_10, sVar4 = ARRAY_LENGTH<cubeb*,4ul>(&local_38), piVar5 < sVar4) {
      cubeb_destroy((cubeb *)0x1371b4);
      local_10 = (int *)((long)local_10 + 1);
    }
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_multiple_contexts)
{
  size_t i;
  int r;
  cubeb * ctx[4];
  int order[4] = {2, 0, 3, 1};
  ASSERT_EQ(ARRAY_LENGTH(ctx), ARRAY_LENGTH(order));

  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    r = common_init(&ctx[i], NULL);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(ctx[i], nullptr);
  }

  /* destroy in a different order */
  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    cubeb_destroy(ctx[order[i]]);
  }
}